

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineResourceSignatureDescWrapper::
AddImmutableSampler<Diligent::ImmutableSamplerDesc_const&>
          (PipelineResourceSignatureDescWrapper *this,ImmutableSamplerDesc *Args)

{
  pointer pIVar1;
  uint uVar2;
  __ireturn_type _Var3;
  allocator local_39;
  value_type local_38;
  
  std::vector<Diligent::ImmutableSamplerDesc,std::allocator<Diligent::ImmutableSamplerDesc>>::
  emplace_back<Diligent::ImmutableSamplerDesc_const&>
            ((vector<Diligent::ImmutableSamplerDesc,std::allocator<Diligent::ImmutableSamplerDesc>>
              *)&this->m_ImmutableSamplers,Args);
  local_38._M_dataplus._M_p =
       (pointer)(((long)(this->m_ImmutableSamplers).
                        super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_ImmutableSamplers).
                       super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x48);
  uVar2 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&local_38);
  (this->m_Desc).NumImmutableSamplers = uVar2;
  pIVar1 = (this->m_ImmutableSamplers).
           super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_Desc).ImmutableSamplers =
       (this->m_ImmutableSamplers).
       super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
       ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_38,pIVar1[-1].SamplerOrTextureName,&local_39);
  _Var3 = std::__detail::
          _Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
          ::insert((_Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                    *)&this->m_StringPool,&local_38);
  pIVar1[-1].SamplerOrTextureName =
       *(Char **)((long)_Var3.first.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 + 8);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void AddImmutableSampler(ArgsType&&... Args)
    {
        m_ImmutableSamplers.emplace_back(std::forward<ArgsType>(Args)...);
        m_Desc.NumImmutableSamplers = StaticCast<Uint32>(m_ImmutableSamplers.size());
        m_Desc.ImmutableSamplers    = m_ImmutableSamplers.data();

        ImmutableSamplerDesc& ImtblSam{m_ImmutableSamplers.back()};
        ImtblSam.SamplerOrTextureName = m_StringPool.insert(ImtblSam.SamplerOrTextureName).first->c_str();
    }